

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O3

int __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)10>::Move_iterator::remove
          (Move_iterator *this,char *__filename)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  int iVar2;
  long in_RDX;
  
  __mutex = *(pthread_mutex_t **)__filename;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    lVar1 = **(long **)(__filename + 0x38);
    this->mtx_ = *(Mutex_t **)(lVar1 + in_RDX * 8);
    *(undefined8 *)(lVar1 + in_RDX * 8) = 0;
    pthread_mutex_unlock(__mutex);
    return (int)this;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

auto remove(Size_t at) -> std::unique_ptr<Event>
            {
                Guard_t g{mtx_};
                return std::move(events_[at]);
            }